

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void GetNodeFunctions(ExpressionContext *ctx,SynBase *source,ExprBase *function,
                     SmallArray<FunctionValue,_32U> *functions)

{
  uint uVar1;
  FunctionValue *pFVar2;
  ExprBase *pEVar3;
  SynBase *pSVar4;
  ExprBase *pEVar5;
  SynBase *pSVar6;
  _func_int **pp_Var7;
  FunctionData *pFVar8;
  
  if ((function == (ExprBase *)0x0) || (pEVar3 = function, function->typeID != 0xe)) {
    pEVar3 = (ExprBase *)0x0;
  }
  if (pEVar3 != (ExprBase *)0x0) {
    function = (ExprBase *)pEVar3[1]._vptr_ExprBase;
  }
  if ((function == (ExprBase *)0x0) || (pEVar3 = function, function->typeID != 0x26)) {
    pEVar3 = (ExprBase *)0x0;
  }
  if (pEVar3 == (ExprBase *)0x0) {
    if ((function == (ExprBase *)0x0) || (pEVar3 = function, function->typeID != 0x24)) {
      pEVar3 = (ExprBase *)0x0;
    }
    if (pEVar3 == (ExprBase *)0x0) {
      if ((function == (ExprBase *)0x0) || (pEVar3 = function, function->typeID != 0x25)) {
        pEVar3 = (ExprBase *)0x0;
      }
      if (pEVar3 == (ExprBase *)0x0) {
        if ((function == (ExprBase *)0x0) || (pEVar3 = function, function->typeID != 0x27)) {
          pEVar3 = (ExprBase *)0x0;
        }
        if (pEVar3 == (ExprBase *)0x0) {
          if ((function == (ExprBase *)0x0) || (function->typeID != 0x28)) {
            function = (ExprBase *)0x0;
          }
          if (function == (ExprBase *)0x0) {
            return;
          }
          pp_Var7 = function[1]._vptr_ExprBase;
          while( true ) {
            if (pp_Var7 == (_func_int **)0x0) {
              return;
            }
            pEVar3 = (ExprBase *)pp_Var7[1];
            if (pEVar3 == (ExprBase *)0x0) break;
            pSVar6 = function->source;
            pFVar8 = (FunctionData *)*pp_Var7;
            if (functions->count == functions->max) {
              SmallArray<FunctionValue,_32U>::grow(functions,functions->count);
            }
            pFVar2 = functions->data;
            if (pFVar2 == (FunctionValue *)0x0) goto LAB_0016074c;
            uVar1 = functions->count;
            functions->count = uVar1 + 1;
            pFVar2[uVar1].source = pSVar6;
            pFVar2[uVar1].function = pFVar8;
            pFVar2[uVar1].context = pEVar3;
            pp_Var7 = (_func_int **)pp_Var7[2];
          }
        }
        else {
          pp_Var7 = pEVar3[1]._vptr_ExprBase;
          while( true ) {
            if (pp_Var7 == (_func_int **)0x0) {
              return;
            }
            pSVar6 = pEVar3[1].source;
            if (pSVar6 == (SynBase *)0x0) {
              pSVar6 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
              pSVar6 = (SynBase *)CreateFunctionContextAccess(ctx,pSVar6,(FunctionData *)*pp_Var7);
            }
            if (pSVar6 == (SynBase *)0x0) break;
            pSVar4 = pEVar3->source;
            pFVar8 = (FunctionData *)*pp_Var7;
            if (functions->count == functions->max) {
              SmallArray<FunctionValue,_32U>::grow(functions,functions->count);
            }
            pFVar2 = functions->data;
            if (pFVar2 == (FunctionValue *)0x0) goto LAB_0016074c;
            uVar1 = functions->count;
            functions->count = uVar1 + 1;
            pFVar2[uVar1].source = pSVar4;
            pFVar2[uVar1].function = pFVar8;
            pFVar2[uVar1].context = (ExprBase *)pSVar6;
            pp_Var7 = (_func_int **)pp_Var7[1];
          }
        }
        goto LAB_0016072d;
      }
    }
    pSVar6 = pEVar3->source;
    pFVar8 = (FunctionData *)pEVar3[1]._vptr_ExprBase;
    pSVar4 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
    pEVar5 = CreateFunctionContextAccess(ctx,pSVar4,(FunctionData *)pEVar3[1]._vptr_ExprBase);
    if (pEVar5 == (ExprBase *)0x0) goto LAB_0016072d;
  }
  else {
    pEVar5 = *(ExprBase **)&pEVar3[1].typeID;
    if (pEVar5 == (ExprBase *)0x0) {
LAB_0016072d:
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                    ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
    }
    pSVar6 = pEVar3->source;
    pFVar8 = (FunctionData *)pEVar3[1]._vptr_ExprBase;
  }
  if (functions->count == functions->max) {
    SmallArray<FunctionValue,_32U>::grow(functions,functions->count);
  }
  pFVar2 = functions->data;
  if (pFVar2 != (FunctionValue *)0x0) {
    uVar1 = functions->count;
    functions->count = uVar1 + 1;
    pFVar2[uVar1].source = pSVar6;
    pFVar2[uVar1].function = pFVar8;
    pFVar2[uVar1].context = pEVar5;
    return;
  }
LAB_0016074c:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<FunctionValue, 32>::push_back(const T &) [T = FunctionValue, N = 32]"
               );
}

Assistant:

void GetNodeFunctions(ExpressionContext &ctx, SynBase *source, ExprBase *function, SmallArray<FunctionValue, 32> &functions)
{
	if(ExprPassthrough *node = getType<ExprPassthrough>(function))
		function = node->value;

	if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, node->context));
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), node->function)));
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(function))
	{
		functions.push_back(FunctionValue(node->source, node->function, CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), node->function)));
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(function))
	{
		for(FunctionHandle *arg = node->functions.head; arg; arg = arg->next)
		{
			ExprBase *context = node->context;

			if(!context)
				context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), arg->function);

			functions.push_back(FunctionValue(node->source, arg->function, context));
		}
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(function))
	{
		for(ShortFunctionHandle *option = node->functions.head; option; option = option->next)
			functions.push_back(FunctionValue(node->source, option->function, option->context));
	}
}